

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

uint64_t __thiscall
poplar::
compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::node_map::operator[](node_map *this,uint64_t i)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  compact_vector *in_RDI;
  uint64_t in_stack_ffffffffffffffc8;
  compact_vector *in_stack_ffffffffffffffd0;
  uint64_t local_8;
  
  bVar1 = bit_vector::operator[]((bit_vector *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  if (bVar1) {
    uVar3 = compact_vector::size(in_RDI);
    if (uVar3 == 0) {
      local_8 = compact_vector::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      local_8 = compact_vector::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      uVar3 = compact_vector::operator[](in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      uVar2 = compact_vector::width(in_RDI + 1);
      local_8 = local_8 | uVar3 << ((byte)uVar2 & 0x3f);
    }
  }
  else {
    local_8 = 0xffffffffffffffff;
  }
  return local_8;
}

Assistant:

uint64_t operator[](uint64_t i) const {
            if (!done_flags_[i]) {
                return UINT64_MAX;
            }
            if (map_high_.size() == 0) {
                return map_low_[i];
            } else {
                return map_low_[i] | (map_high_[i] << map_low_.width());
            }
        }